

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O0

xmlChar * xmlTextReaderReadOuterXml(xmlTextReaderPtr reader)

{
  xmlDtdPtr dtd;
  xmlDocPtr doc_00;
  int iVar1;
  xmlNodePtr pxVar2;
  xmlBufferPtr buf;
  xmlDocPtr doc;
  xmlBufferPtr buff;
  xmlNodePtr node;
  xmlChar *resbuf;
  xmlTextReaderPtr reader_local;
  
  pxVar2 = xmlTextReaderExpand(reader);
  if (pxVar2 == (xmlNodePtr)0x0) {
    reader_local = (xmlTextReaderPtr)0x0;
  }
  else {
    dtd = (xmlDtdPtr)reader->node;
    doc_00 = dtd->doc;
    if (dtd->type == XML_DTD_NODE) {
      buff = (xmlBufferPtr)xmlCopyDtd(dtd);
    }
    else {
      buff = (xmlBufferPtr)xmlDocCopyNode((xmlNodePtr)dtd,doc_00,1);
    }
    buf = xmlBufferCreate();
    xmlBufferSetAllocationScheme(buf,XML_BUFFER_ALLOC_DOUBLEIT);
    iVar1 = xmlNodeDump(buf,doc_00,(xmlNodePtr)buff,0,0);
    if (iVar1 == -1) {
      xmlFreeNode((xmlNodePtr)buff);
      xmlBufferFree(buf);
      reader_local = (xmlTextReaderPtr)0x0;
    }
    else {
      reader_local = (xmlTextReaderPtr)buf->content;
      buf->content = (xmlChar *)0x0;
      xmlFreeNode((xmlNodePtr)buff);
      xmlBufferFree(buf);
    }
  }
  return (xmlChar *)reader_local;
}

Assistant:

xmlChar *
xmlTextReaderReadOuterXml(xmlTextReaderPtr reader ATTRIBUTE_UNUSED)
{
    xmlChar *resbuf;
    xmlNodePtr node;
    xmlBufferPtr buff;
    xmlDocPtr doc;

    if (xmlTextReaderExpand(reader) == NULL) {
        return NULL;
    }
    node = reader->node;
    doc = node->doc;
    /* XXX: Why is the node copied? */
	if (node->type == XML_DTD_NODE) {
		node = (xmlNodePtr) xmlCopyDtd((xmlDtdPtr) node);
	} else {
		node = xmlDocCopyNode(node, doc, 1);
	}
    buff = xmlBufferCreate();
    xmlBufferSetAllocationScheme(buff, XML_BUFFER_ALLOC_DOUBLEIT);
    if (xmlNodeDump(buff, doc, node, 0, 0) == -1) {
        xmlFreeNode(node);
        xmlBufferFree(buff);
        return NULL;
    }

    resbuf = buff->content;
    buff->content = NULL;

    xmlFreeNode(node);
    xmlBufferFree(buff);
    return resbuf;
}